

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-filter-tokens.cc
# Opt level: O0

void __thiscall StringReverser::handleToken(StringReverser *this,Token *token)

{
  token_type_e tVar1;
  string *psVar2;
  Token local_c0;
  char *local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string local_38 [8];
  string value;
  Token *token_local;
  StringReverser *this_local;
  
  value.field_2._8_8_ = token;
  tVar1 = QPDFTokenizer::Token::getType(token);
  if (tVar1 == tt_string) {
    psVar2 = QPDFTokenizer::Token::getValue_abi_cxx11_((Token *)value.field_2._8_8_);
    std::__cxx11::string::string(local_38,(string *)psVar2);
    local_40._M_current = (char *)std::__cxx11::string::begin();
    local_48 = (char *)std::__cxx11::string::end();
    std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (local_40,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_48);
    QPDFTokenizer::Token::Token(&local_c0,tt_string,local_38);
    QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
    QPDFTokenizer::Token::~Token(&local_c0);
    std::__cxx11::string::~string(local_38);
  }
  else {
    QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
  }
  return;
}

Assistant:

void
StringReverser::handleToken(QPDFTokenizer::Token const& token)
{
    // For string tokens, reverse the characters. For other tokens, just pass them through. Notice
    // that we construct a new string token and write that, thus allowing the library to handle any
    // subtleties about properly encoding unprintable characters. This function doesn't handle
    // multibyte characters at all. It's not intended to be an example of the correct way to reverse
    // strings. It's just intended to give a simple example of a pretty minimal filter and to show
    // an example of writing a constructed token.
    if (token.getType() == QPDFTokenizer::tt_string) {
        std::string value = token.getValue();
        std::reverse(value.begin(), value.end());
        writeToken(QPDFTokenizer::Token(QPDFTokenizer::tt_string, value));
    } else {
        writeToken(token);
    }
}